

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# location_impl.hpp
# Opt level: O0

void __thiscall toml::detail::location::retrace(location *this)

{
  location *in_RDI;
  
  if (in_RDI->location_ == 0) {
    in_RDI->location_ = 0;
    in_RDI->line_number_ = 1;
    in_RDI->column_number_ = 1;
  }
  else {
    retrace_impl(in_RDI);
  }
  return;
}

Assistant:

TOML11_INLINE void location::retrace(/*restricted to n=1*/) noexcept
{
    assert(this->is_ok());
    if(this->location_ == 0)
    {
        this->location_ = 0;
        this->line_number_ = 1;
        this->column_number_ = 1;
    }
    else
    {
        this->retrace_impl();
    }
}